

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

ArgIface * __thiscall Args::CmdLine::findArgument(CmdLine *this,String *name)

{
  pointer ppCVar1;
  int iVar2;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var3;
  undefined4 extraout_var;
  ArgIface *pAVar4;
  ArgIface *pAVar5;
  pointer ppCVar6;
  bool bVar7;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_pred<Args::CmdLine::findArgument(std::__cxx11::string_const&)::_lambda(auto:1_const&)_1_>>
                    ((this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var3._M_current ==
      (this->m_args).
      super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppCVar6 = (this->m_prevCommand).
              super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_prevCommand).
              super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar6 != ppCVar1) {
      pAVar4 = Command::findChild(*ppCVar6,name);
      if (pAVar4 == (ArgIface *)0x0) {
        do {
          ppCVar6 = ppCVar6 + 1;
          bVar7 = ppCVar6 == ppCVar1;
          pAVar5 = pAVar4;
          if (bVar7) break;
          pAVar5 = Command::findChild(*ppCVar6,name);
        } while (pAVar5 == (ArgIface *)0x0);
      }
      else {
        bVar7 = false;
        pAVar5 = pAVar4;
      }
      if (!bVar7) {
        return pAVar5;
      }
    }
    pAVar4 = (ArgIface *)0x0;
  }
  else {
    iVar2 = (*(((_Var3._M_current)->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[2])();
    pAVar4 = ((_Var3._M_current)->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    if (iVar2 != 0) {
      iVar2 = (*pAVar4->_vptr_ArgIface[0xe])(pAVar4,name);
      return (ArgIface *)CONCAT44(extraout_var,iVar2);
    }
  }
  return pAVar4;
}

Assistant:

ArgIface * findArgument( const String & name )
	{
		auto it = std::find_if( m_args.begin(),
			m_args.end(), [ &name ] ( const auto & arg ) -> bool
				{ return ( arg->findArgument( name ) != nullptr ); } );

		if( it != m_args.end() )
		{
			if( (*it)->type() == ArgType::Command )
				return it->get();
			else
				return (*it)->findArgument( name );
		}
		else if( !m_prevCommand.empty() )
		{
			for( const auto & c : m_prevCommand )
			{
				ArgIface * tmp = c->findChild( name );

				if( tmp )
					return tmp;
			}
		}

		return nullptr;
	}